

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_StoreTruthEqual(Ses_TruthEntry_t *pEntry,word *pTruth,int nVars)

{
  int iVar1;
  int local_28;
  int i;
  int nVars_local;
  word *pTruth_local;
  Ses_TruthEntry_t *pEntry_local;
  
  if (pEntry->nVars == nVars) {
    for (local_28 = 0; iVar1 = Abc_TtWordNum(nVars), local_28 < iVar1; local_28 = local_28 + 1) {
      if (pEntry->pTruth[local_28] != pTruth[local_28]) {
        return 0;
      }
    }
    pEntry_local._4_4_ = 1;
  }
  else {
    pEntry_local._4_4_ = 0;
  }
  return pEntry_local._4_4_;
}

Assistant:

static inline int Ses_StoreTruthEqual( Ses_TruthEntry_t * pEntry, word * pTruth, int nVars )
{
    int i;

    if ( pEntry->nVars != nVars )
        return 0;

    for ( i = 0; i < Abc_TtWordNum( nVars ); ++i )
        if ( pEntry->pTruth[i] != pTruth[i] )
            return 0;
    return 1;
}